

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O3

void __thiscall
Query::Query(Query *this,QueryType *type,vector<Query,_std::allocator<Query>_> *queries)

{
  pointer pQVar1;
  
  this->type = *type;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->ngram).itype = GRAM3;
  (this->ngram).trigram = 0;
  this->count = 0;
  pQVar1 = (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
             super__Vector_impl_data._M_start;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = pQVar1;
  (this->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (queries->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  return;
}

Assistant:

Query::Query(const QueryType &type, std::vector<Query> &&queries)
    : type(type), count(0), queries(std::move(queries)) {}